

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.c
# Opt level: O1

size_t mz_zip_reader_extract_iter_read
                 (mz_zip_reader_extract_iter_state *pState,void *pvBuf,size_t buf_size)

{
  mz_zip_archive *pmVar1;
  bool bVar2;
  tinfl_status tVar3;
  size_t sVar4;
  mz_ulong mVar5;
  ulong uVar6;
  size_t sVar7;
  ulong uVar8;
  mz_uint8 *pOut_buf_next;
  size_t __n;
  ulong __n_00;
  size_t out_buf_size;
  size_t in_buf_size;
  size_t local_48;
  mz_uint64 local_40;
  tinfl_decompressor *local_38;
  
  if (((pState == (mz_zip_reader_extract_iter_state *)0x0) ||
      (pmVar1 = pState->pZip, pmVar1 == (mz_zip_archive *)0x0)) ||
     (pvBuf == (void *)0x0 || pmVar1->m_pState == (mz_zip_internal_state *)0x0)) {
    __n = 0;
  }
  else if (((pState->flags & 0x400) == 0) && ((pState->file_stat).m_method != 0)) {
    local_38 = &pState->inflator;
    __n = 0;
    do {
      uVar8 = (ulong)((uint)pState->out_buf_ofs & 0x7fff);
      local_48 = 0x8000 - uVar8;
      pOut_buf_next = (mz_uint8 *)(uVar8 + (long)pState->pWrite_buf);
      if (pState->out_blk_remain == 0) {
        if ((pState->read_buf_avail != 0) ||
           (pmVar1 = pState->pZip, pmVar1->m_pState->m_pMem != (void *)0x0)) {
LAB_00108408:
          local_40 = pState->read_buf_avail;
          tVar3 = tinfl_decompress(local_38,(mz_uint8 *)
                                            ((long)pState->pRead_buf + pState->read_buf_ofs),
                                   &local_40,(mz_uint8 *)pState->pWrite_buf,pOut_buf_next,&local_48,
                                   (uint)(pState->comp_remaining != 0) * 2);
          pState->status = tVar3;
          pState->read_buf_avail = pState->read_buf_avail - local_40;
          pState->read_buf_ofs = pState->read_buf_ofs + local_40;
          pState->out_blk_remain = local_48;
          goto LAB_00108465;
        }
        uVar8 = pState->comp_remaining;
        if (pState->read_buf_size < pState->comp_remaining) {
          uVar8 = pState->read_buf_size;
        }
        pState->read_buf_avail = uVar8;
        sVar4 = (*pmVar1->m_pRead)(pmVar1->m_pIO_opaque,pState->cur_file_ofs,pState->pRead_buf,uVar8
                                  );
        sVar7 = pState->read_buf_avail;
        if (sVar4 == sVar7) {
          pState->cur_file_ofs = pState->cur_file_ofs + sVar7;
          pState->comp_remaining = pState->comp_remaining - sVar7;
          pState->read_buf_ofs = 0;
          goto LAB_00108408;
        }
        if (pState->pZip != (mz_zip_archive *)0x0) {
          pState->pZip->m_last_error = MZ_ZIP_FILE_READ_FAILED;
        }
        pState->status = -1;
        bVar2 = false;
      }
      else {
LAB_00108465:
        uVar8 = pState->out_blk_remain;
        if (uVar8 == 0) {
          bVar2 = true;
        }
        else {
          __n_00 = buf_size - __n;
          if (uVar8 <= buf_size - __n) {
            __n_00 = uVar8;
          }
          memcpy((void *)((long)pvBuf + __n),pOut_buf_next,__n_00);
          mVar5 = mz_crc32((ulong)pState->file_crc32,pOut_buf_next,__n_00);
          pState->file_crc32 = (mz_uint)mVar5;
          pState->out_blk_remain = pState->out_blk_remain - __n_00;
          uVar6 = pState->out_buf_ofs + __n_00;
          pState->out_buf_ofs = uVar6;
          uVar8 = (pState->file_stat).m_uncomp_size;
          bVar2 = uVar6 <= uVar8;
          if (uVar8 < uVar6) {
            if (pState->pZip != (mz_zip_archive *)0x0) {
              pState->pZip->m_last_error = MZ_ZIP_DECOMPRESSION_FAILED;
            }
            pState->status = -1;
          }
          else {
            __n = __n + __n_00;
          }
        }
      }
    } while (((bVar2) && (__n < buf_size)) && (pState->status - 1U < 2));
  }
  else {
    __n = buf_size;
    if (pState->comp_remaining < buf_size) {
      __n = pState->comp_remaining;
    }
    if (pmVar1->m_pState->m_pMem == (void *)0x0) {
      sVar7 = (*pmVar1->m_pRead)(pmVar1->m_pIO_opaque,pState->cur_file_ofs,pvBuf,__n);
      if (sVar7 != __n) {
        if (pState->pZip != (mz_zip_archive *)0x0) {
          pState->pZip->m_last_error = MZ_ZIP_FILE_READ_FAILED;
        }
        pState->status = -1;
        __n = 0;
      }
    }
    else {
      memcpy(pvBuf,pState->pRead_buf,__n);
      pState->pRead_buf = (void *)((long)pState->pRead_buf + __n);
    }
    if ((pState->flags & 0x400) == 0) {
      mVar5 = mz_crc32((ulong)pState->file_crc32,(mz_uint8 *)pvBuf,__n);
      pState->file_crc32 = (mz_uint)mVar5;
    }
    pState->cur_file_ofs = pState->cur_file_ofs + __n;
    pState->out_buf_ofs = pState->out_buf_ofs + __n;
    pState->comp_remaining = pState->comp_remaining - __n;
  }
  return __n;
}

Assistant:

size_t mz_zip_reader_extract_iter_read(mz_zip_reader_extract_iter_state* pState, void* pvBuf, size_t buf_size)
{
    size_t copied_to_caller = 0;

    /* Argument sanity check */
    if ((!pState) || (!pState->pZip) || (!pState->pZip->m_pState) || (!pvBuf))
        return 0;

    if ((pState->flags & MZ_ZIP_FLAG_COMPRESSED_DATA) || (!pState->file_stat.m_method))
    {
        /* The file is stored or the caller has requested the compressed data, calc amount to return. */
        copied_to_caller = MZ_MIN( buf_size, pState->comp_remaining );

        /* Zip is in memory....or requires reading from a file? */
        if (pState->pZip->m_pState->m_pMem)
        {
            /* Copy data to caller's buffer */
            memcpy( pvBuf, pState->pRead_buf, copied_to_caller );
            pState->pRead_buf = ((mz_uint8*)pState->pRead_buf) + copied_to_caller;
        }
        else
        {
            /* Read directly into caller's buffer */
            if (pState->pZip->m_pRead(pState->pZip->m_pIO_opaque, pState->cur_file_ofs, pvBuf, copied_to_caller) != copied_to_caller)
            {
                /* Failed to read all that was asked for, flag failure and alert user */
                mz_zip_set_error(pState->pZip, MZ_ZIP_FILE_READ_FAILED);
                pState->status = TINFL_STATUS_FAILED;
                copied_to_caller = 0;
            }
        }

#ifndef MINIZ_DISABLE_ZIP_READER_CRC32_CHECKS
        /* Compute CRC if not returning compressed data only */
        if (!(pState->flags & MZ_ZIP_FLAG_COMPRESSED_DATA))
            pState->file_crc32 = (mz_uint32)mz_crc32(pState->file_crc32, (const mz_uint8 *)pvBuf, copied_to_caller);
#endif

        /* Advance offsets, dec counters */
        pState->cur_file_ofs += copied_to_caller;
        pState->out_buf_ofs += copied_to_caller;
        pState->comp_remaining -= copied_to_caller;
    }
    else
    {
        do
        {
            /* Calc ptr to write buffer - given current output pos and block size */
            mz_uint8 *pWrite_buf_cur = (mz_uint8 *)pState->pWrite_buf + (pState->out_buf_ofs & (TINFL_LZ_DICT_SIZE - 1));

            /* Calc max output size - given current output pos and block size */
            size_t in_buf_size, out_buf_size = TINFL_LZ_DICT_SIZE - (pState->out_buf_ofs & (TINFL_LZ_DICT_SIZE - 1));

            if (!pState->out_blk_remain)
            {
                /* Read more data from file if none available (and reading from file) */
                if ((!pState->read_buf_avail) && (!pState->pZip->m_pState->m_pMem))
                {
                    /* Calc read size */
                    pState->read_buf_avail = MZ_MIN(pState->read_buf_size, pState->comp_remaining);
                    if (pState->pZip->m_pRead(pState->pZip->m_pIO_opaque, pState->cur_file_ofs, pState->pRead_buf, (size_t)pState->read_buf_avail) != pState->read_buf_avail)
                    {
                        mz_zip_set_error(pState->pZip, MZ_ZIP_FILE_READ_FAILED);
                        pState->status = TINFL_STATUS_FAILED;
                        break;
                    }

                    /* Advance offsets, dec counters */
                    pState->cur_file_ofs += pState->read_buf_avail;
                    pState->comp_remaining -= pState->read_buf_avail;
                    pState->read_buf_ofs = 0;
                }

                /* Perform decompression */
                in_buf_size = (size_t)pState->read_buf_avail;
                pState->status = tinfl_decompress(&pState->inflator, (const mz_uint8 *)pState->pRead_buf + pState->read_buf_ofs, &in_buf_size, (mz_uint8 *)pState->pWrite_buf, pWrite_buf_cur, &out_buf_size, pState->comp_remaining ? TINFL_FLAG_HAS_MORE_INPUT : 0);
                pState->read_buf_avail -= in_buf_size;
                pState->read_buf_ofs += in_buf_size;

                /* Update current output block size remaining */
                pState->out_blk_remain = out_buf_size;
            }

            if (pState->out_blk_remain)
            {
                /* Calc amount to return. */
                size_t to_copy = MZ_MIN( (buf_size - copied_to_caller), pState->out_blk_remain );

                /* Copy data to caller's buffer */
                memcpy( (uint8_t*)pvBuf + copied_to_caller, pWrite_buf_cur, to_copy );

#ifndef MINIZ_DISABLE_ZIP_READER_CRC32_CHECKS
                /* Perform CRC */
                pState->file_crc32 = (mz_uint32)mz_crc32(pState->file_crc32, pWrite_buf_cur, to_copy);
#endif

                /* Decrement data consumed from block */
                pState->out_blk_remain -= to_copy;

                /* Inc output offset, while performing sanity check */
                if ((pState->out_buf_ofs += to_copy) > pState->file_stat.m_uncomp_size)
                {
                    mz_zip_set_error(pState->pZip, MZ_ZIP_DECOMPRESSION_FAILED);
                    pState->status = TINFL_STATUS_FAILED;
                    break;
                }

                /* Increment counter of data copied to caller */
                copied_to_caller += to_copy;
            }
        } while ( (copied_to_caller < buf_size) && ((pState->status == TINFL_STATUS_NEEDS_MORE_INPUT) || (pState->status == TINFL_STATUS_HAS_MORE_OUTPUT)) );
    }

    /* Return how many bytes were copied into user buffer */
    return copied_to_caller;
}